

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

void __thiscall
absl::strings_internal::BigUnsigned<84>::BigUnsigned(BigUnsigned<84> *this,string_view sv)

{
  bool bVar1;
  int iVar2;
  const_iterator pvVar3;
  char *pcVar4;
  BigUnsigned<84> *this_00;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  BigUnsigned<84> *unaff_retaddr;
  int exponent_adjust;
  int in_stack_ffffffffffffffac;
  _func_bool_uchar *in_stack_ffffffffffffffc0;
  
  in_RDI[0] = '\0';
  in_RDI[1] = '\0';
  in_RDI[2] = '\0';
  in_RDI[3] = '\0';
  pcVar4 = in_RDI;
  memset(in_RDI + 4,0,0x150);
  iVar2 = (int)((ulong)pcVar4 >> 0x20);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0);
  std::basic_string_view<char,_std::char_traits<char>_>::end
            ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0);
  pcVar4 = std::find_if_not<char_const*,bool(*)(unsigned_char)>
                     (pvVar3,in_RDI,in_stack_ffffffffffffffc0);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0);
  if ((pcVar4 == pvVar3) &&
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xfffffffffffffff0), !bVar1)) {
    std::basic_string_view<char,_std::char_traits<char>_>::data
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0);
    this_00 = (BigUnsigned<84> *)
              std::basic_string_view<char,_std::char_traits<char>_>::data
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &stack0xfffffffffffffff0);
    std::basic_string_view<char,_std::char_traits<char>_>::size
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0);
    Digits10();
    iVar2 = ReadDigits(unaff_retaddr,in_RDX,in_RSI,iVar2);
    if (0 < iVar2) {
      MultiplyByTenToTheNth(this_00,in_stack_ffffffffffffffac);
    }
  }
  return;
}

Assistant:

explicit BigUnsigned(absl::string_view sv) : size_(0), words_{} {
    // Check for valid input, returning a 0 otherwise.  This is reasonable
    // behavior only because this constructor is for unit tests.
    if (std::find_if_not(sv.begin(), sv.end(), ascii_isdigit) != sv.end() ||
        sv.empty()) {
      return;
    }
    int exponent_adjust =
        ReadDigits(sv.data(), sv.data() + sv.size(), Digits10() + 1);
    if (exponent_adjust > 0) {
      MultiplyByTenToTheNth(exponent_adjust);
    }
  }